

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticpyramid.cpp
# Opt level: O2

void pzgeom::TPZQuadraticPyramid::TShape<double>
               (TPZVec<double> *par,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double *pdVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  
  pdVar13 = par->fStore;
  dVar1 = pdVar13[2];
  dVar20 = dVar1 + -1.0;
  if (1e-06 <= ABS(dVar20)) {
    dVar2 = *pdVar13;
    dVar3 = pdVar13[1];
    dVar4 = dVar3 + 1.0;
    dVar27 = dVar3 + -1.0;
    dVar26 = dVar1 + dVar27;
    dVar5 = dVar2 + -1.0 + dVar1;
    dVar6 = dVar20 * 4.0;
    pdVar13 = TPZFMatrix<double>::operator()(phi,0,0);
    *pdVar13 = ((dVar2 + dVar4) * dVar26 * dVar5) / dVar6;
    dVar14 = dVar2 + 1.0;
    dVar15 = dVar14 - dVar1;
    pdVar13 = TPZFMatrix<double>::operator()(phi,1,0);
    *pdVar13 = (-(dVar4 - dVar2) * dVar15 * dVar26) / dVar6;
    dVar7 = dVar4 - dVar1;
    pdVar13 = TPZFMatrix<double>::operator()(phi,2,0);
    *pdVar13 = (-(dVar2 + dVar27) * dVar7 * dVar15) / dVar6;
    pdVar13 = TPZFMatrix<double>::operator()(phi,3,0);
    *pdVar13 = ((dVar27 - dVar2) * dVar7 * dVar5) / dVar6;
    dVar27 = dVar1 + dVar1;
    pdVar13 = TPZFMatrix<double>::operator()(phi,4,0);
    *pdVar13 = (dVar27 + -1.0) * dVar1;
    dVar8 = dVar20 + dVar20;
    pdVar13 = TPZFMatrix<double>::operator()(phi,5,0);
    dVar21 = dVar1 + (-1.0 - dVar2);
    dVar24 = dVar1 + (-1.0 - dVar3);
    *pdVar13 = (dVar21 * dVar26 * dVar5) / dVar8;
    pdVar13 = TPZFMatrix<double>::operator()(phi,6,0);
    *pdVar13 = (dVar24 * dVar26 * dVar21) / dVar8;
    dVar9 = dVar20 * dVar20;
    dVar16 = dVar2 * dVar2;
    pdVar13 = TPZFMatrix<double>::operator()(phi,7,0);
    *pdVar13 = ((dVar16 - dVar9) * dVar7) / dVar8;
    dVar17 = dVar3 * dVar3;
    pdVar13 = TPZFMatrix<double>::operator()(phi,8,0);
    *pdVar13 = (dVar5 * (dVar9 - dVar17)) / dVar8;
    dVar10 = -(dVar1 * dVar26);
    pdVar13 = TPZFMatrix<double>::operator()(phi,9,0);
    *pdVar13 = (dVar5 * dVar10) / dVar20;
    pdVar13 = TPZFMatrix<double>::operator()(phi,10,0);
    *pdVar13 = (dVar10 * dVar21) / dVar20;
    pdVar13 = TPZFMatrix<double>::operator()(phi,0xb,0);
    *pdVar13 = (dVar15 * dVar7 * dVar1) / (1.0 - dVar1);
    dVar24 = dVar24 * dVar1;
    pdVar13 = TPZFMatrix<double>::operator()(phi,0xc,0);
    *pdVar13 = (-dVar24 * dVar5) / dVar20;
    dVar10 = dVar2 + dVar2 + dVar3;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,0);
    *pdVar13 = ((dVar1 + dVar10) * dVar26) / dVar6;
    dVar11 = dVar3 + dVar3;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,0);
    *pdVar13 = ((dVar1 + dVar11 + dVar2) * dVar5) / dVar6;
    dVar25 = (dVar16 + dVar2 + -dVar20 * dVar20) * dVar3;
    dVar12 = dVar17 * dVar2;
    dVar18 = dVar9 * 4.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,0);
    *pdVar13 = -((dVar12 + dVar25) - dVar14 * dVar9) / dVar18;
    dVar19 = dVar3 - (dVar2 + dVar2);
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,1);
    *pdVar13 = (-dVar26 * (dVar1 + dVar19)) / dVar6;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,1);
    *pdVar13 = (((dVar2 - dVar11) - dVar1) * dVar15) / dVar6;
    dVar22 = -dVar2 * dVar2;
    dVar23 = -(dVar2 + -1.0) * dVar9;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,1);
    *pdVar13 = ((dVar22 + dVar2 + dVar9) * dVar3 + dVar12 + dVar23) / dVar18;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,2);
    *pdVar13 = (-dVar7 * (dVar10 - dVar1)) / dVar6;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,2);
    *pdVar13 = (-dVar15 * ((dVar11 + dVar2) - dVar1)) / dVar6;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,2);
    *pdVar13 = (((dVar16 - dVar2) + -dVar20 * dVar20) * dVar3 + dVar12 + dVar23) / dVar18;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,3);
    *pdVar13 = ((dVar19 - dVar1) * dVar7) / dVar6;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,3);
    *pdVar13 = (((dVar11 - dVar2) - dVar1) * dVar5) / dVar6;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,3);
    *pdVar13 = ((dVar25 - dVar12) + dVar14 * dVar9) / dVar18;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,4);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,4);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,4);
    *pdVar13 = dVar1 * 4.0 + -1.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,5);
    *pdVar13 = (-dVar2 * dVar26) / dVar20;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,5);
    *pdVar13 = (dVar22 + dVar9) / dVar8;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,5);
    *pdVar13 = ((dVar16 * dVar3) / dVar9 + dVar3 + -2.0 + dVar27) * 0.5;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,6);
    *pdVar13 = (dVar17 - dVar9) / dVar8;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,6);
    *pdVar13 = (dVar15 * dVar3) / dVar20;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,6);
    *pdVar13 = (-0.5 - dVar17 / (dVar9 + dVar9)) * dVar2 + -1.0 + dVar1;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,7);
    *pdVar13 = (dVar2 * dVar7) / dVar20;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,7);
    *pdVar13 = (dVar16 - dVar9) / dVar8;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,7);
    *pdVar13 = (-0.5 - dVar16 / (dVar9 + dVar9)) * dVar3 + -1.0 + dVar1;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,8);
    *pdVar13 = (dVar9 - dVar17) / dVar8;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,8);
    *pdVar13 = (-dVar3 * dVar5) / dVar20;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,8);
    *pdVar13 = (dVar12 / dVar9 + dVar2 + -2.0 + dVar27) * 0.5;
    dVar6 = (dVar1 * dVar26) / dVar20;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,9);
    *pdVar13 = -dVar6;
    dVar5 = (dVar5 * dVar1) / dVar20;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,9);
    *pdVar13 = -dVar5;
    dVar27 = dVar1 * -2.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,9);
    *pdVar13 = (dVar2 / dVar9 + -1.0) * dVar3 + (1.0 - dVar2) + dVar27;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,10);
    *pdVar13 = dVar6;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,10);
    *pdVar13 = (dVar15 * dVar1) / dVar20;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,10);
    *pdVar13 = (-1.0 - dVar2 / dVar9) * dVar3 + dVar14 + dVar27;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,0xb);
    *pdVar13 = dVar24 / dVar20;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,0xb);
    *pdVar13 = (dVar21 * dVar1) / dVar20;
    dVar9 = (dVar2 * dVar3) / dVar9;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,0xb);
    *pdVar13 = dVar2 + dVar4 + dVar9 + dVar27;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,0xc);
    *pdVar13 = (dVar7 * dVar1) / dVar20;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,0xc);
    *pdVar13 = dVar5;
    dVar27 = ((dVar4 - dVar2) - dVar9) + dVar27;
  }
  else {
    pdVar13 = TPZFMatrix<double>::operator()(phi,0,0);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(phi,1,0);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(phi,2,0);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(phi,3,0);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(phi,4,0);
    *pdVar13 = 1.0;
    pdVar13 = TPZFMatrix<double>::operator()(phi,5,0);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(phi,6,0);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(phi,7,0);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(phi,8,0);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(phi,9,0);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(phi,10,0);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(phi,0xb,0);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(phi,0xc,0);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,0);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,0);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,0);
    *pdVar13 = -0.25;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,1);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,1);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,1);
    *pdVar13 = -0.25;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,2);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,2);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,2);
    *pdVar13 = -0.25;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,3);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,3);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,3);
    *pdVar13 = -0.25;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,4);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,4);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,4);
    *pdVar13 = 3.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,5);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,5);
    *pdVar13 = 0.5;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,5);
    *pdVar13 = 0.5;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,6);
    *pdVar13 = -0.5;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,6);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,6);
    *pdVar13 = 0.5;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,7);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,7);
    *pdVar13 = -0.5;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,7);
    *pdVar13 = 0.5;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,8);
    *pdVar13 = 0.5;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,8);
    *pdVar13 = 0.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,8);
    *pdVar13 = 0.5;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,9);
    *pdVar13 = -1.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,9);
    *pdVar13 = -1.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,9);
    *pdVar13 = -1.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,10);
    *pdVar13 = 1.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,10);
    *pdVar13 = -1.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,10);
    *pdVar13 = -1.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,0xb);
    *pdVar13 = 1.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,0xb);
    *pdVar13 = 1.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,0xb);
    *pdVar13 = -1.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,0xc);
    *pdVar13 = -1.0;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,0xc);
    *pdVar13 = 1.0;
    dVar27 = -1.0;
  }
  pdVar13 = TPZFMatrix<double>::operator()(dphi,2,0xc);
  *pdVar13 = dVar27;
  return;
}

Assistant:

void TPZQuadraticPyramid::TShape(const TPZVec<T> &par,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
    
    T qsi = par[0], eta = par[1], zeta = par[2];
    T check = zeta-1.;
    if(fabs(check) < 1.E-6)
    {
        phi(0,0)  = 0.;
        phi(1,0)  = 0.;
        phi(2,0)  = 0.;
        phi(3,0)  = 0.;
        phi(4,0)  = 1.;
        phi(5,0)  = 0.;
        phi(6,0)  = 0.;
        phi(7,0)  = 0.;
        phi(8,0)  = 0.;
        phi(9,0)  = 0.;
        phi(10,0) = 0.;
        phi(11,0) = 0.;
        phi(12,0) = 0.;
        
        dphi(0,0) = 0.;
        dphi(1,0) = 0.;
        dphi(2,0) = -0.25;
        
        dphi(0,1) = 0.;
        dphi(1,1) = 0.;
        dphi(2,1) = -0.25;
        
        dphi(0,2) = 0.;
        dphi(1,2) = 0.;
        dphi(2,2) = -0.25;
        
        dphi(0,3) = 0.;
        dphi(1,3) = 0.;
        dphi(2,3) = -0.25;
        
        dphi(0,4) = 0.;
        dphi(1,4) = 0.;
        dphi(2,4) = 3.;
        
        dphi(0,5) = 0.;
        dphi(1,5) = 0.5;
        dphi(2,5) = 0.5;
        
        dphi(0,6) = -0.5;
        dphi(1,6) = 0.;
        dphi(2,6) = 0.5;
        
        dphi(0,7) = 0.;
        dphi(1,7) = -0.5;
        dphi(2,7) = 0.5;
        
        dphi(0,8) = 0.5;
        dphi(1,8) = 0.;
        dphi(2,8) = 0.5;
        
        dphi(0,9) = -1.;
        dphi(1,9) = -1.;
        dphi(2,9) = -1.;
        
        dphi(0,10) = 1.;
        dphi(1,10) = -1.;
        dphi(2,10) = -1.;
        
        dphi(0,11) = 1.;
        dphi(1,11) = 1.;
        dphi(2,11) = -1.;
        
        dphi(0,12) = -1;
        dphi(1,12) = 1.;
        dphi(2,12) = -1.;
        
        return;
    }

    phi(0,0) = ((1 + eta + qsi)*(-1 + eta + zeta)*(-1 + qsi + zeta))/(4.*(-1 + zeta));
    phi(1,0) = -((1 + eta - qsi)*(1 + qsi - zeta)*(-1 + eta + zeta))/(4.*(-1 + zeta));
    phi(2,0) = -((-1 + eta + qsi)*(1 + eta - zeta)*(1 + qsi - zeta))/(4.*(-1 + zeta));
    phi(3,0) = ((-1 + eta - qsi)*(1 + eta - zeta)*(-1 + qsi + zeta))/(4.*(-1 + zeta));
    phi(4,0) = zeta*(-1 + 2*zeta);
    phi(5,0) = ((-1 + eta + zeta)*(-1 - qsi + zeta)*(-1 + qsi + zeta))/(2.*(-1 + zeta));
    phi(6,0) = ((-1 - eta + zeta)*(-1 + eta + zeta)*(-1 - qsi + zeta))/(2.*(-1 + zeta));
    phi(7,0) = ((qsi*qsi - (-1 + zeta)*(-1 + zeta))*(1 + eta - zeta))/(2.*(-1 + zeta));
    phi(8,0) = ((-(eta*eta) + (-1 + zeta)*(-1 + zeta))*(-1 + qsi + zeta))/(2.*(-1 + zeta));
    phi(9,0) = -((zeta*(-1 + eta + zeta)*(-1 + qsi + zeta))/(-1 + zeta));
    phi(10,0) = -((zeta*(-1 + eta + zeta)*(-1 - qsi + zeta))/(-1 + zeta));
    phi(11,0) = ((1 + eta - zeta)*(1 + qsi - zeta)*zeta)/(1 - zeta);
    phi(12,0) = -((zeta*(-1 - eta + zeta)*(-1 + qsi + zeta))/(-1 + zeta));


    dphi(0,0) = ((-1 + eta + zeta)*(eta + 2*qsi + zeta))/(4.*(-1 + zeta));
    dphi(1,0) = ((-1 + qsi + zeta)*(2*eta + qsi + zeta))/(4.*(-1 + zeta));
    dphi(2,0) = -(eta*eta*qsi + eta*(qsi + qsi*qsi - (-1 + zeta)*(-1 + zeta)) - (1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,1) = -((-1 + eta + zeta)*(eta - 2*qsi + zeta))/(4.*(-1 + zeta));
    dphi(1,1) = ((1 + qsi - zeta)*(-2*eta + qsi - zeta))/(4.*(-1 + zeta));
    dphi(2,1) = (eta*eta*qsi + eta*(qsi - qsi*qsi + (-1 + zeta)*(-1 + zeta)) - (-1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,2) = -((1 + eta - zeta)*(eta + 2*qsi - zeta))/(4.*(-1 + zeta));
    dphi(1,2) = -((1 + qsi - zeta)*(2*eta + qsi - zeta))/(4.*(-1 + zeta));
    dphi(2,2) = (eta*eta*qsi + eta*(-qsi + qsi*qsi - (-1 + zeta)*(-1 + zeta)) - (-1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,3) = ((1 + eta - zeta)*(eta - 2*qsi - zeta))/(4.*(-1 + zeta));
    dphi(1,3) = ((2*eta - qsi - zeta)*(-1 + qsi + zeta))/(4.*(-1 + zeta));
    dphi(2,3) = (-(eta*eta*qsi) + eta*(qsi + qsi*qsi - (-1 + zeta)*(-1 + zeta)) + (1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,4) = 0;
    dphi(1,4) = 0;
    dphi(2,4) = -1 + 4*zeta;

    dphi(0,5) = -((qsi*(-1 + eta + zeta))/(-1 + zeta));
    dphi(1,5) = (-(qsi*qsi) + (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(2,5) = (-2 + eta + (eta*(qsi*qsi))/((-1 + zeta)*(-1 + zeta)) + 2*zeta)/2.;

    dphi(0,6) = (eta*eta - (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(1,6) = (eta*(1 + qsi - zeta))/(-1 + zeta);
    dphi(2,6) = -1 + qsi*(-0.5 - (eta*eta)/(2.*((-1 + zeta)*(-1 + zeta)))) + zeta;

    dphi(0,7) = (qsi*(1 + eta - zeta))/(-1 + zeta);
    dphi(1,7) = (qsi*qsi - (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(2,7) = -1 + eta*(-0.5 - (qsi*qsi)/(2.*((-1 + zeta)*(-1 + zeta)))) + zeta;

    dphi(0,8) = (-(eta*eta) + (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(1,8) = -((eta*(-1 + qsi + zeta))/(-1 + zeta));
    dphi(2,8) = (-2 + qsi + (eta*eta*qsi)/((-1 + zeta)*(-1 + zeta)) + 2*zeta)/2.;

    dphi(0,9) = -((zeta*(-1 + eta + zeta))/(-1 + zeta));
    dphi(1,9) = -((zeta*(-1 + qsi + zeta))/(-1 + zeta));
    dphi(2,9) = 1 - qsi + eta*(-1 + qsi/((-1 + zeta)*(-1 + zeta))) - 2*zeta;

    dphi(0,10) = (zeta*(-1 + eta + zeta))/(-1 + zeta);
    dphi(1,10) = ((1 + qsi - zeta)*zeta)/(-1 + zeta);
    dphi(2,10) = 1 + qsi + eta*(-1 - qsi/((-1 + zeta)*(-1 + zeta))) - 2*zeta;

    dphi(0,11) = (zeta*(-1 - eta + zeta))/(-1 + zeta);
    dphi(1,11) = (zeta*(-1 - qsi + zeta))/(-1 + zeta);
    dphi(2,11) = 1 + eta + qsi + (eta*qsi)/((-1 + zeta)*(-1 + zeta)) - 2*zeta;

    dphi(0,12) = ((1 + eta - zeta)*zeta)/(-1 + zeta);
    dphi(1,12) = (zeta*(-1 + qsi + zeta))/(-1 + zeta);
    dphi(2,12) = 1 + eta - qsi - (eta*qsi)/((-1 + zeta)*(-1 + zeta)) - 2*zeta;
    
}